

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float ImGui::SliderCalcRatioFromValueT<float,float>
                (ImGuiDataType data_type,float v,float v_min,float v_max,float power,
                float linear_zero_pos)

{
  int in_EDI;
  float in_XMM0_Da;
  float fVar1;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float f_1;
  float f;
  float v_clamped;
  bool is_power;
  float local_34;
  bool local_2e;
  float local_4;
  
  if ((in_XMM1_Da != in_XMM2_Da) || (NAN(in_XMM1_Da) || NAN(in_XMM2_Da))) {
    local_2e = false;
    if ((in_XMM3_Da != 1.0) || (NAN(in_XMM3_Da))) {
      local_2e = in_EDI == 8 || in_EDI == 9;
    }
    if (in_XMM2_Da <= in_XMM1_Da) {
      local_34 = ImClamp<float>(in_XMM0_Da,in_XMM2_Da,in_XMM1_Da);
    }
    else {
      local_34 = ImClamp<float>(in_XMM0_Da,in_XMM1_Da,in_XMM2_Da);
    }
    if (local_2e) {
      if (0.0 <= local_34) {
        ImMax<float>(0.0,in_XMM1_Da);
        ImMax<float>(0.0,in_XMM1_Da);
        fVar1 = ImPow(0.0,3.212531e-39);
        local_4 = fVar1 * (1.0 - in_XMM4_Da) + in_XMM4_Da;
      }
      else {
        ImMin<float>(0.0,in_XMM2_Da);
        fVar1 = ImPow(0.0,3.212297e-39);
        local_4 = (1.0 - fVar1) * in_XMM4_Da;
      }
    }
    else {
      local_4 = (local_34 - in_XMM1_Da) / (in_XMM2_Da - in_XMM1_Da);
    }
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

float ImGui::SliderCalcRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, float power, float linear_zero_pos)
{
    if (v_min == v_max)
        return 0.0f;

    const bool is_power = (power != 1.0f) && (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double);
    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_power)
    {
        if (v_clamped < 0.0f)
        {
            const float f = 1.0f - (float)((v_clamped - v_min) / (ImMin((TYPE)0, v_max) - v_min));
            return (1.0f - ImPow(f, 1.0f/power)) * linear_zero_pos;
        }
        else
        {
            const float f = (float)((v_clamped - ImMax((TYPE)0, v_min)) / (v_max - ImMax((TYPE)0, v_min)));
            return linear_zero_pos + ImPow(f, 1.0f/power) * (1.0f - linear_zero_pos);
        }
    }

    // Linear slider
    return (float)((FLOATTYPE)(v_clamped - v_min) / (FLOATTYPE)(v_max - v_min));
}